

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O0

void __thiscall btDbvtNodeEnumerator::Process(btDbvtNodeEnumerator *this,btDbvtNode *n)

{
  btDbvtNode **in_RDI;
  btAlignedObjectArray<const_btDbvtNode_*> *unaff_retaddr;
  
  btAlignedObjectArray<const_btDbvtNode_*>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void Process(const btDbvtNode* n) { nodes.push_back(n); }